

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::NumberPair,_Js::NumberPair,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined1 auVar1 [16];
  uint newSize;
  ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair> *pIVar2;
  uint uVar3;
  int iVar4;
  hash_t hVar5;
  SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *dst;
  SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *pSVar6;
  int *piVar7;
  size_t byteSize;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  newSize = this->count * 2;
  local_34[0] = 0x4b;
  uVar3 = 4;
  if (8 < newSize) {
    uVar3 = this->count & 0x7fffffff;
  }
  uVar3 = PrimePolicy::GetPrime(uVar3,local_34);
  local_48 = (Type)0x0;
  newBuckets = (int *)0x0;
  uVar8 = (ulong)(int)newSize;
  if (uVar3 == this->bucketCount) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0xc),0);
    }
    dst = (SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *)
          Memory::NoCheckHeapAllocator::AllocZero(this->alloc,byteSize);
    if (newSize != 0) {
      pSVar6 = dst;
      do {
        pIVar2 = &(pSVar6->
                  super_DefaultHashedEntry<Js::NumberPair,_Js::NumberPair,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  ).super_ImplicitKeyValueEntry<Js::NumberPair,_Js::NumberPair>;
        (pIVar2->
        super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
        ).super_ValueEntryData<Js::NumberPair>.value.x = 0xffffffff;
        (pIVar2->
        super_ValueEntry<Js::NumberPair,_JsUtil::(anonymous_namespace)::ValueEntryData<Js::NumberPair>_>
        ).super_ValueEntryData<Js::NumberPair>.value.y = 0xffffffff;
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != dst + uVar8);
    }
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Js::NumberPair,Js::NumberPair>,Js::NumberPair,Memory::NoCheckHeapAllocator>
              (dst,uVar8,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,uVar3,newSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Js::NumberPair,Js::NumberPair>,Js::NumberPair,Memory::NoCheckHeapAllocator>
              ((SimpleHashedEntry<Js::NumberPair,_Js::NumberPair> *)newBuckets,uVar8,this->entries,
               (long)this->count);
    this->modFunctionIndex = local_34[0];
    iVar4 = this->count;
    if (0 < iVar4) {
      lVar9 = 8;
      lVar10 = 0;
      piVar7 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar7 + lVar9)) {
          uVar8 = *(ulong *)((long)piVar7 + lVar9 + -8);
          hVar5 = PrimePolicy::ModPrime
                            ((uint)((int)(uVar8 >> 0x1f) + (int)uVar8 * 0x20000) >> 1,uVar3,
                             this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar9) = local_48[(int)hVar5];
          local_48[(int)hVar5] = (int)lVar10;
          iVar4 = this->count;
          piVar7 = newBuckets;
        }
        lVar10 = lVar10 + 1;
        lVar9 = lVar9 + 0xc;
      } while (lVar10 < iVar4);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = (Type)newBuckets;
    this->bucketCount = uVar3;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }